

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_2::GeometryInputTestInstance::genVertexAttribData
          (GeometryInputTestInstance *this)

{
  reference pvVar1;
  Vector<float,_4> local_278;
  int local_268;
  int i;
  Vector<float,_4> local_254;
  undefined8 local_244;
  undefined8 local_23c;
  Vector<float,_4> local_234;
  Vector<float,_4> local_224;
  undefined8 local_214;
  undefined8 local_20c;
  Vector<float,_4> local_204;
  Vector<float,_4> local_1f4;
  undefined8 local_1e4;
  undefined8 local_1dc;
  Vector<float,_4> local_1d4;
  Vector<float,_4> local_1c4;
  undefined8 local_1b4;
  undefined8 local_1ac;
  Vector<float,_4> local_1a4;
  Vector<float,_4> local_194;
  undefined8 local_184;
  undefined8 local_17c;
  Vector<float,_4> local_174;
  Vector<float,_4> local_164;
  undefined8 local_154;
  undefined8 local_14c;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  undefined8 local_124;
  undefined8 local_11c;
  Vector<float,_4> local_114;
  Vector<float,_4> local_104;
  undefined8 local_f4;
  undefined8 local_ec;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  undefined8 local_c4;
  undefined8 local_bc;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  undefined8 local_94;
  undefined8 local_8c;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined8 local_64;
  undefined8 local_5c;
  Vector<float,_4> local_54;
  Vector<float,_4> local_44;
  undefined8 local_34;
  undefined8 local_2c;
  undefined1 local_24 [8];
  Vec4 offset;
  float scale;
  GeometryInputTestInstance *this_local;
  
  offset.m_data[2] = 0.3;
  unique0x100009df = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_24,-0.5,-0.2,0.0,1.0);
  (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices = 0xc;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,
             (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices);
  tcu::Vector<float,_4>::Vector(&local_54,0.0,0.0,0.0,0.0);
  tcu::operator*((tcu *)&local_44,&local_54,0.3);
  tcu::operator+((tcu *)&local_34,&local_44,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_34;
  *(undefined8 *)(pvVar1->m_data + 2) = local_2c;
  tcu::Vector<float,_4>::Vector(&local_84,-1.0,-1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_74,&local_84,0.3);
  tcu::operator+((tcu *)&local_64,&local_74,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,1);
  *(undefined8 *)pvVar1->m_data = local_64;
  *(undefined8 *)(pvVar1->m_data + 2) = local_5c;
  tcu::Vector<float,_4>::Vector(&local_b4,0.0,-1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_a4,&local_b4,0.3);
  tcu::operator+((tcu *)&local_94,&local_a4,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,2);
  *(undefined8 *)pvVar1->m_data = local_94;
  *(undefined8 *)(pvVar1->m_data + 2) = local_8c;
  tcu::Vector<float,_4>::Vector(&local_e4,1.0,1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_d4,&local_e4,0.3);
  tcu::operator+((tcu *)&local_c4,&local_d4,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,3);
  *(undefined8 *)pvVar1->m_data = local_c4;
  *(undefined8 *)(pvVar1->m_data + 2) = local_bc;
  tcu::Vector<float,_4>::Vector(&local_114,1.0,0.0,0.0,0.0);
  tcu::operator*((tcu *)&local_104,&local_114,0.3);
  tcu::operator+((tcu *)&local_f4,&local_104,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,4);
  *(undefined8 *)pvVar1->m_data = local_f4;
  *(undefined8 *)(pvVar1->m_data + 2) = local_ec;
  tcu::Vector<float,_4>::Vector(&local_144,0.0,-2.0,0.0,0.0);
  tcu::operator*((tcu *)&local_134,&local_144,0.3);
  tcu::operator+((tcu *)&local_124,&local_134,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,5);
  *(undefined8 *)pvVar1->m_data = local_124;
  *(undefined8 *)(pvVar1->m_data + 2) = local_11c;
  tcu::Vector<float,_4>::Vector(&local_174,1.0,-1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_164,&local_174,0.3);
  tcu::operator+((tcu *)&local_154,&local_164,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,6);
  *(undefined8 *)pvVar1->m_data = local_154;
  *(undefined8 *)(pvVar1->m_data + 2) = local_14c;
  tcu::Vector<float,_4>::Vector(&local_1a4,2.0,1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_194,&local_1a4,0.3);
  tcu::operator+((tcu *)&local_184,&local_194,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,7);
  *(undefined8 *)pvVar1->m_data = local_184;
  *(undefined8 *)(pvVar1->m_data + 2) = local_17c;
  tcu::Vector<float,_4>::Vector(&local_1d4,2.0,0.0,0.0,0.0);
  tcu::operator*((tcu *)&local_1c4,&local_1d4,0.3);
  tcu::operator+((tcu *)&local_1b4,&local_1c4,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,8);
  *(undefined8 *)pvVar1->m_data = local_1b4;
  *(undefined8 *)(pvVar1->m_data + 2) = local_1ac;
  tcu::Vector<float,_4>::Vector(&local_204,1.0,-2.0,0.0,0.0);
  tcu::operator*((tcu *)&local_1f4,&local_204,0.3);
  tcu::operator+((tcu *)&local_1e4,&local_1f4,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,9);
  *(undefined8 *)pvVar1->m_data = local_1e4;
  *(undefined8 *)(pvVar1->m_data + 2) = local_1dc;
  tcu::Vector<float,_4>::Vector(&local_234,2.0,-1.0,0.0,0.0);
  tcu::operator*((tcu *)&local_224,&local_234,0.3);
  tcu::operator+((tcu *)&local_214,&local_224,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,10);
  *(undefined8 *)pvVar1->m_data = local_214;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20c;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffd9c,3.0,0.0,0.0,0.0);
  tcu::operator*((tcu *)&local_254,(Vector<float,_4> *)&stack0xfffffffffffffd9c,0.3);
  tcu::operator+((tcu *)&local_244,&local_254,(Vector<float,_4> *)local_24);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,0xb);
  *(undefined8 *)pvVar1->m_data = local_244;
  *(undefined8 *)(pvVar1->m_data + 2) = local_23c;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData,
             (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices);
  for (local_268 = 0; local_268 < (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices
      ; local_268 = local_268 + 1) {
    if (local_268 % 2 == 0) {
      tcu::Vector<float,_4>::Vector(&local_278,1.0,1.0,1.0,1.0);
    }
    else {
      tcu::Vector<float,_4>::Vector(&local_278,1.0,0.0,0.0,1.0);
    }
    pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&(this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData,
                        (long)local_268);
    *(undefined8 *)pvVar1->m_data = local_278.m_data._0_8_;
    *(undefined8 *)(pvVar1->m_data + 2) = local_278.m_data._8_8_;
  }
  return;
}

Assistant:

void GeometryInputTestInstance::genVertexAttribData (void)
{
	// Create 1 X 2 grid in triangle strip adjacent - order
	const float	scale	= 0.3f;
	const Vec4	offset	(-0.5f, -0.2f, 0.0f, 1.0f);
	m_numDrawVertices	= 12;

	m_vertexPosData.resize(m_numDrawVertices);
	m_vertexPosData[ 0] = Vec4( 0,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 1] = Vec4(-1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 2] = Vec4( 0, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 3] = Vec4( 1,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 4] = Vec4( 1,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 5] = Vec4( 0, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 6] = Vec4( 1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 7] = Vec4( 2,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 8] = Vec4( 2,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 9] = Vec4( 1, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[10] = Vec4( 2, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[11] = Vec4( 3,  0, 0.0f, 0.0f) * scale + offset;

	// Red and white
	m_vertexAttrData.resize(m_numDrawVertices);
	for (int i = 0; i < m_numDrawVertices; ++i)
		m_vertexAttrData[i] = (i % 2 == 0) ? Vec4(1, 1, 1, 1) : Vec4(1, 0, 0, 1);
}